

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O0

char * getVarName(char *suffixFormula,int startLoc,int *endLocation)

{
  int iVar1;
  char *name;
  int length;
  int i;
  int *endLocation_local;
  int startLoc_local;
  char *suffixFormula_local;
  
  iVar1 = isNotVarNameSymbol(suffixFormula[startLoc]);
  name._4_4_ = startLoc;
  if (iVar1 == 0) {
    while (iVar1 = isNotVarNameSymbol(suffixFormula[name._4_4_]), iVar1 == 0) {
      name._4_4_ = name._4_4_ + 1;
    }
    *endLocation = name._4_4_;
    iVar1 = name._4_4_ - startLoc;
    suffixFormula_local = (char *)malloc((long)(iVar1 + 1));
    for (name._4_4_ = 0; name._4_4_ < iVar1; name._4_4_ = name._4_4_ + 1) {
      suffixFormula_local[name._4_4_] = suffixFormula[name._4_4_ + startLoc];
    }
    suffixFormula_local[name._4_4_] = '\0';
  }
  else {
    suffixFormula_local = (char *)0x0;
  }
  return suffixFormula_local;
}

Assistant:

char *getVarName( char *suffixFormula, int startLoc, int *endLocation )
{
	int i = startLoc, length;
	char *name;

	if( isNotVarNameSymbol( suffixFormula[startLoc] ) )
		return NULL;

	while( !isNotVarNameSymbol( suffixFormula[i] ) )
		i++;
	*endLocation = i;
	length = i - startLoc;
	name = (char *)malloc( sizeof(char) * (length + 1));
	for( i=0; i<length; i++ )
		name[i] = suffixFormula[i+startLoc];
	name[i] = '\0';

	return name;
}